

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void ggml_fp32_to_bf16_row(float *x,ggml_bf16_t *y,int64_t n)

{
  ggml_bf16_t gVar1;
  undefined2 in_DX;
  undefined6 in_register_00000012;
  long in_RSI;
  long in_RDI;
  int i;
  undefined4 local_1c;
  
  for (local_1c = 0; (long)local_1c < CONCAT62(in_register_00000012,in_DX); local_1c = local_1c + 1)
  {
    gVar1 = ggml_compute_fp32_to_bf16(*(float *)(in_RDI + (long)local_1c * 4));
    *(uint16_t *)(in_RSI + (long)local_1c * 2) = gVar1.bits;
  }
  return;
}

Assistant:

void ggml_fp32_to_bf16_row(const float * x, ggml_bf16_t * y, int64_t n) {
  int i = 0;
#if defined(__AVX512BF16__)
  // subnormals are flushed to zero on this platform
  for (; i + 32 <= n; i += 32) {
        _mm512_storeu_si512(
            (__m512i *)(y + i),
            m512i(_mm512_cvtne2ps_pbh(_mm512_loadu_ps(x + i + 16),
                                _mm512_loadu_ps(x + i))));
  }
#endif
    for (; i < n; i++) {
        y[i] = GGML_FP32_TO_BF16(x[i]);
    }
}